

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrAsciiOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,long *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  anon_union_16_2_67f50693_for_value local_70;
  anon_union_16_2_67f50693_for_value local_60;
  ulong local_50;
  idx_t local_48;
  ValidityMask *local_40;
  long *local_38;
  
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar6 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ldata->value + lVar6 * 2);
        local_60._0_8_ = *puVar1;
        local_60.pointer.ptr = (char *)puVar1[1];
        puVar1 = (undefined8 *)((long)&rdata->value + lVar6 * 2);
        local_70._0_8_ = *puVar1;
        local_70.pointer.ptr = (char *)puVar1[1];
        iVar4 = FindStrInStr((string_t *)&local_60.pointer,(string_t *)&local_70.pointer);
        *(idx_t *)((long)result_data + lVar6) = iVar4 + 1;
        lVar6 = lVar6 + 8;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    uVar7 = 0;
    uVar9 = 0;
    local_48 = count;
    do {
      puVar2 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar10 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar10 = count;
        }
LAB_0104b9dd:
        uVar3 = uVar7;
        if (uVar7 < uVar10) {
          uVar5 = uVar7 << 4 | 8;
          do {
            puVar1 = (undefined8 *)((long)ldata + (uVar5 - 8));
            local_60._0_8_ = *puVar1;
            local_60.pointer.ptr = (char *)puVar1[1];
            puVar1 = (undefined8 *)((long)rdata + (uVar5 - 8));
            local_70._0_8_ = *puVar1;
            local_70.pointer.ptr = (char *)puVar1[1];
            iVar4 = FindStrInStr((string_t *)&local_60.pointer,(string_t *)&local_70.pointer);
            result_data[uVar7] = iVar4 + 1;
            uVar7 = uVar7 + 1;
            uVar5 = uVar5 + 0x10;
            uVar3 = uVar10;
          } while (uVar10 != uVar7);
        }
      }
      else {
        uVar5 = puVar2[uVar9];
        uVar10 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar10 = count;
        }
        uVar3 = uVar10;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) goto LAB_0104b9dd;
          uVar3 = uVar7;
          if (uVar7 < uVar10) {
            local_38 = result_data + uVar7;
            uVar8 = uVar7 << 4 | 8;
            uVar11 = 0;
            do {
              if ((uVar5 >> (uVar11 & 0x3f) & 1) != 0) {
                puVar1 = (undefined8 *)((long)ldata + (uVar8 - 8));
                local_60._0_8_ = *puVar1;
                local_60.pointer.ptr = (char *)puVar1[1];
                puVar1 = (undefined8 *)((long)rdata + (uVar8 - 8));
                local_70._0_8_ = *puVar1;
                local_70.pointer.ptr = (char *)puVar1[1];
                iVar4 = FindStrInStr((string_t *)&local_60.pointer,(string_t *)&local_70.pointer);
                local_38[uVar11] = iVar4 + 1;
              }
              uVar11 = uVar11 + 1;
              uVar8 = uVar8 + 0x10;
              uVar3 = uVar10;
              count = local_48;
            } while (uVar10 - uVar7 != uVar11);
          }
        }
      }
      uVar7 = uVar3;
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}